

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mdspan.h
# Opt level: O2

index_type __thiscall
Gudhi::layout_right::
mapping<Gudhi::extents<unsigned_long,18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>const>
::operator()(mapping<Gudhi::extents<unsigned_long,18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>const>
             *this,initializer_list<unsigned_long> *indices)

{
  ulong uVar1;
  index_type iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  mapping<Gudhi::extents<unsigned_long,18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>const>
  *pmVar5;
  long lVar6;
  ulong uVar7;
  
  if (indices->_M_len == 3) {
    pmVar5 = this + 0x18;
    lVar6 = 0;
    iVar2 = 0;
    while( true ) {
      if (lVar6 == 0x18) {
        return iVar2;
      }
      uVar7 = 0xffffffffffffffff;
      if (-1 < (long)*(int *)pmVar5) {
        uVar7 = *(ulong *)(this + (long)*(int *)pmVar5 * 8);
      }
      uVar1 = *(ulong *)((long)indices->_M_array + lVar6);
      if (uVar7 <= uVar1) break;
      iVar2 = iVar2 + uVar1 * *(long *)(this + lVar6 + 0x28);
      pmVar5 = pmVar5 + 4;
      lVar6 = lVar6 + 8;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "Out of bound index.";
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "Wrong number of parameters.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

constexpr index_type operator()(const IndexRange& indices) const
    {
      GUDHI_CHECK(indices.size() == extents_type::rank(), "Wrong number of parameters.");

      index_type newIndex = 0;
      auto it = indices.begin();
      GUDHI_CHECK_code(unsigned int i = 0);
      for (auto stride : ext_shifts_) {
        GUDHI_CHECK_code(GUDHI_CHECK(*it < exts_.extent(i), "Out of bound index."));
        newIndex += (stride * (*it));
        ++it;
        GUDHI_CHECK_code(++i);
      }

      return newIndex;
    }